

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.h
# Opt level: O0

ElectromagneticEmissionSystemData * __thiscall
DIS::ElectromagneticEmissionSystemData::operator=
          (ElectromagneticEmissionSystemData *this,ElectromagneticEmissionSystemData *param_1)

{
  uchar uVar1;
  unsigned_short uVar2;
  ElectromagneticEmissionSystemData *param_1_local;
  ElectromagneticEmissionSystemData *this_local;
  
  uVar1 = param_1->_numberOfBeams;
  uVar2 = param_1->_emissionsPadding2;
  this->_systemDataLength = param_1->_systemDataLength;
  this->_numberOfBeams = uVar1;
  this->_emissionsPadding2 = uVar2;
  EmitterSystem::operator=(&this->_emitterSystem,&param_1->_emitterSystem);
  Vector3Float::operator=(&this->_location,&param_1->_location);
  std::
  vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
  ::operator=(&this->_beamDataRecords,&param_1->_beamDataRecords);
  return this;
}

Assistant:

class OPENDIS7_EXPORT ElectromagneticEmissionSystemData
{
protected:
  /**  this field shall specify the length of this emitter system's data in 32-bit words. */
  unsigned char _systemDataLength;

  /** the number of beams being described in the current PDU for the emitter system being described.  */
  unsigned char _numberOfBeams;

  /* padding. */
  unsigned short _emissionsPadding2;

 /**  information about a particular emitter system and shall be represented by an Emitter System record (see 6.2.23). */
  EmitterSystem _emitterSystem; 

  /** the location of the antenna beam source with respect to the emitting entity's coordinate system. This location shall be the origin of the emitter coordinate system that shall have the same orientation as the entity coordinate system. This field shall be represented by an Entity Coordinate Vector record see 6.2.95  */
  Vector3Float _location; 

  /** Electromagnetic emmissions systems */
  std::vector<ElectromagneticEmissionBeamData> _beamDataRecords;

 public:
     ElectromagneticEmissionSystemData();
    virtual ~ElectromagneticEmissionSystemData();

    unsigned char getSystemDataLength() const;
    void setSystemDataLength(unsigned char pX);

    unsigned char getNumberOfBeams() const; 

    unsigned short getEmissionsPadding2() const;
    void setEmissionsPadding2(unsigned short pX);

    EmitterSystem& getEmitterSystem(); 
    const EmitterSystem&  getEmitterSystem() const; 
    void setEmitterSystem(const EmitterSystem    &pX);

    Vector3Float& getLocation(); 
    const Vector3Float&  getLocation() const; 
    void setLocation(const Vector3Float    &pX);

    std::vector<ElectromagneticEmissionBeamData>& getBeamDataRecords();
    const std::vector<ElectromagneticEmissionBeamData>& getBeamDataRecords() const;
    void setBeamDataRecords(const std::vector<ElectromagneticEmissionBeamData>& pX);

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

virtual int getMarshalledSize() const;

     bool operator  ==(const ElectromagneticEmissionSystemData& rhs) const;
}